

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

char * stringcache_len_internal(StringCache *cache,char *str,uint len,int addmissing)

{
  undefined8 *puVar1;
  char *__s1;
  StringBucket **ppSVar2;
  uint32 uVar3;
  int iVar4;
  long *plVar5;
  StringBucket *pSVar6;
  undefined8 *puVar7;
  uint uVar8;
  long *plVar9;
  ulong len_00;
  
  len_00 = (ulong)len;
  uVar3 = hash_string(str,len_00);
  uVar8 = cache->table_size - 1 & uVar3 & 0xff;
  plVar9 = (long *)((ulong)(uVar8 << 3) + (long)cache->hashtable);
  plVar5 = plVar9;
  puVar7 = (undefined8 *)0x0;
  while( true ) {
    puVar1 = (undefined8 *)*plVar5;
    if (puVar1 == (undefined8 *)0x0) {
      if ((addmissing != 0) &&
         (pSVar6 = (StringBucket *)(*cache->m)(len + 0x11,cache->d), pSVar6 != (StringBucket *)0x0))
      {
        pSVar6->string = (char *)(pSVar6 + 1);
        memcpy(pSVar6 + 1,str,len_00);
        *(undefined1 *)((long)&pSVar6[1].string + len_00) = 0;
        ppSVar2 = cache->hashtable;
        pSVar6->next = ppSVar2[uVar8];
        ppSVar2[uVar8] = pSVar6;
        return pSVar6->string;
      }
      return (char *)0x0;
    }
    __s1 = (char *)*puVar1;
    iVar4 = strncmp(__s1,str,len_00);
    if ((iVar4 == 0) && (__s1[len_00] == '\0')) break;
    plVar5 = puVar1 + 1;
    puVar7 = puVar1;
  }
  if (puVar7 == (undefined8 *)0x0) {
    return __s1;
  }
  if ((undefined8 *)puVar7[1] == puVar1) {
    puVar7[1] = puVar1[1];
    puVar1[1] = *plVar9;
    *plVar9 = (long)puVar1;
    return __s1;
  }
  __assert_fail("prev->next == bucket",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                ,0x173,
                "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
               );
}

Assistant:

static const char *stringcache_len_internal(StringCache *cache,
                                            const char *str,
                                            const unsigned int len,
                                            const int addmissing)
{
    const uint8 hash = hash_string(str, len) & (cache->table_size-1);
    StringBucket *bucket = cache->hashtable[hash];
    StringBucket *prev = NULL;
    while (bucket)
    {
        const char *bstr = bucket->string;
        if ((strncmp(bstr, str, len) == 0) && (bstr[len] == 0))
        {
            // Matched! Move this to the front of the list.
            if (prev != NULL)
            {
                assert(prev->next == bucket);
                prev->next = bucket->next;
                bucket->next = cache->hashtable[hash];
                cache->hashtable[hash] = bucket;
            } // if
            return bstr; // already cached
        } // if
        prev = bucket;
        bucket = bucket->next;
    } // while

    // no match!
    if (!addmissing)
        return NULL;

    // add to the table.
    bucket = (StringBucket *) cache->m(sizeof (StringBucket) + len + 1, cache->d);
    if (bucket == NULL)
        return NULL;
    bucket->string = (char *)(bucket + 1);
    memcpy(bucket->string, str, len);
    bucket->string[len] = '\0';
    bucket->next = cache->hashtable[hash];
    cache->hashtable[hash] = bucket;
    return bucket->string;
}